

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O2

void __thiscall Diligent::FramebufferCache::~FramebufferCache(FramebufferCache *this)

{
  string msg;
  string local_30;
  
  if ((this->m_Cache)._M_h._M_element_count != 0) {
    FormatString<char[34]>(&local_30,(char (*) [34])"All framebuffers must be released");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~FramebufferCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
               ,0xc1);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->m_ViewToKeyMap)._M_h._M_element_count != 0) {
    FormatString<char[64]>
              (&local_30,
               (char (*) [64])"All image views must be released and the cache must be notified");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~FramebufferCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
               ,0xc2);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->m_RenderPassToKeyMap)._M_h._M_element_count != 0) {
    FormatString<char[66]>
              (&local_30,
               (char (*) [66])"All render passes must be released and the cache must be notified");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~FramebufferCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::
  _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&(this->m_RenderPassToKeyMap)._M_h);
  std::
  _Hashtable<VkImageView_T_*,_std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>,_std::__detail::_Select1st,_std::equal_to<VkImageView_T_*>,_std::hash<VkImageView_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&(this->m_ViewToKeyMap)._M_h);
  std::
  _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_Cache)._M_h);
  return;
}

Assistant:

FramebufferCache::~FramebufferCache()
{
    VERIFY(m_Cache.empty(), "All framebuffers must be released");
    VERIFY(m_ViewToKeyMap.empty(), "All image views must be released and the cache must be notified");
    VERIFY(m_RenderPassToKeyMap.empty(), "All render passes must be released and the cache must be notified");
}